

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

size_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::TotalCharge(ShardedLRUCache *this)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  long lVar2;
  size_t sVar3;
  
  lVar2 = 0;
  sVar3 = 0;
  do {
    __mutex = (pthread_mutex_t *)(this->shard_[0].lru_.key_data + lVar2 + -0x74);
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    sVar3 = sVar3 + *(long *)(this->shard_[0].lru_.key_data + lVar2 + -0x4c);
    pthread_mutex_unlock(__mutex);
    lVar2 = lVar2 + 0xd8;
  } while (lVar2 != 0xd80);
  return sVar3;
}

Assistant:

size_t TotalCharge() const override {
    size_t total = 0;
    for (int s = 0; s < kNumShards; s++) {
      total += shard_[s].TotalCharge();
    }
    return total;
  }